

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockParameterTest_twoInterleavedOutputParameters_TestShell::createTest
          (TEST_MockParameterTest_twoInterleavedOutputParameters_TestShell *this)

{
  Utest *this_00;
  TEST_MockParameterTest_twoInterleavedOutputParameters_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
                                  ,0x2d9);
  TEST_MockParameterTest_twoInterleavedOutputParameters_Test::
  TEST_MockParameterTest_twoInterleavedOutputParameters_Test
            ((TEST_MockParameterTest_twoInterleavedOutputParameters_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockParameterTest, twoInterleavedOutputParameters)
{
    int param1 = 55;
    int retval1 = 1;
    int param2 = 77;
    int retval2 = 2;

    mock().expectOneCall("function").withOutputParameterReturning("parameterName", &retval1, sizeof(retval1)).withParameter("id", 1);
    mock().expectOneCall("function").withOutputParameterReturning("parameterName", &retval2, sizeof(retval2)).withParameter("id", 2);
    mock().actualCall("function").withOutputParameter("parameterName", &param2).withParameter("id", 2);
    mock().actualCall("function").withOutputParameter("parameterName", &param1).withParameter("id", 1);

    CHECK_EQUAL(retval1, param1);
    CHECK_EQUAL(retval2, param2);
    mock().checkExpectations();
}